

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder.cc
# Opt level: O0

bool __thiscall draco::MeshEdgebreakerEncoder::InitializeEncoder(MeshEdgebreakerEncoder *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  ValueType VVar4;
  int iVar5;
  uint uVar6;
  EncoderOptions *this_00;
  unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  *puVar7;
  pointer pMVar8;
  MeshEncoder *in_RDI;
  int selected_edgebreaker_method;
  bool is_tiny_mesh;
  bool is_predictive_edgebreaker_available;
  bool is_standard_edgebreaker_available;
  string *in_stack_fffffffffffffee8;
  EncoderOptionsBase<int> *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff10;
  allocator<char> *in_stack_ffffffffffffff20;
  allocator<char> *__a;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined6 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 uVar9;
  allocator<char> in_stack_ffffffffffffff67;
  string local_98 [16];
  EncoderOptionsBase<int> *in_stack_ffffffffffffff78;
  int local_78;
  allocator<char> local_71;
  string local_70 [35];
  byte local_4d;
  allocator<char> local_39;
  string local_38 [39];
  byte local_11;
  bool local_1;
  
  PointCloudEncoder::options(&in_RDI->super_PointCloudEncoder);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff20);
  bVar1 = EncoderOptionsBase<int>::IsFeatureSupported
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_11 = bVar1 & 1;
  this_00 = PointCloudEncoder::options(&in_RDI->super_PointCloudEncoder);
  __a = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(bVar1,in_stack_ffffffffffffff28),__a);
  bVar2 = EncoderOptionsBase<int>::IsFeatureSupported
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_4d = bVar2 & 1;
  std::
  unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
  ::operator=((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
               *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  MeshEncoder::mesh(in_RDI);
  VVar4 = Mesh::num_faces((Mesh *)0x1911a1);
  PointCloudEncoder::options(&in_RDI->super_PointCloudEncoder);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             (char *)CONCAT17(bVar1,in_stack_ffffffffffffff28),__a);
  local_78 = DracoOptions<int>::GetGlobalInt
                       (&in_stack_fffffffffffffef0->super_DracoOptions<int>,
                        in_stack_fffffffffffffee8,0);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
  if (local_78 == -1) {
    if ((local_11 & 1) != 0) {
      PointCloudEncoder::options(&in_RDI->super_PointCloudEncoder);
      iVar5 = EncoderOptionsBase<int>::GetSpeed(in_stack_ffffffffffffff78);
      if (((4 < iVar5) || ((local_4d & 1) == 0)) || (VVar4 < 1000)) {
        local_78 = 0;
        goto LAB_00191366;
      }
    }
    local_78 = 2;
  }
LAB_00191366:
  if (local_78 == 0) {
    if ((local_11 & 1) != 0) {
      PointCloudEncoder::buffer(&in_RDI->super_PointCloudEncoder);
      uVar9 = 0;
      EncoderBuffer::Encode<unsigned_char>
                ((EncoderBuffer *)this_00,(uchar *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
      puVar7 = (unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                *)operator_new(0x260);
      MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::MeshEdgebreakerEncoderImpl
                ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *)
                 CONCAT17(in_stack_ffffffffffffff67,CONCAT16(uVar9,in_stack_ffffffffffffff60)));
      std::
      unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>>
      ::unique_ptr<std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>,void>
                (puVar7,(pointer)in_stack_fffffffffffffee8);
      std::
      unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
      ::operator=(puVar7,(unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                          *)in_stack_fffffffffffffee8);
      std::
      unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
      ::~unique_ptr(puVar7);
    }
  }
  else if (local_78 == 2) {
    PointCloudEncoder::buffer(&in_RDI->super_PointCloudEncoder);
    EncoderBuffer::Encode<unsigned_char>
              ((EncoderBuffer *)this_00,(uchar *)CONCAT17(bVar2,in_stack_ffffffffffffff10));
    puVar7 = (unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
              *)operator_new(0x2c8);
    MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::
    MeshEdgebreakerEncoderImpl
              ((MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,in_stack_ffffffffffffff60)));
    std::
    unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>>
    ::unique_ptr<std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>,void>
              ((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                *)in_stack_fffffffffffffef0,(pointer)puVar7);
    std::
    unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    ::operator=((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                 *)in_stack_fffffffffffffef0,puVar7);
    std::
    unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
    ::~unique_ptr((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                   *)in_stack_fffffffffffffef0);
  }
  bVar3 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                      *)0x1914c4);
  if (bVar3) {
    pMVar8 = std::
             unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
             ::operator->((unique_ptr<draco::MeshEdgebreakerEncoderImplInterface,_std::default_delete<draco::MeshEdgebreakerEncoderImplInterface>_>
                           *)0x1914e3);
    uVar6 = (*pMVar8->_vptr_MeshEdgebreakerEncoderImplInterface[2])(pMVar8,in_RDI);
    if ((uVar6 & 1) == 0) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MeshEdgebreakerEncoder::InitializeEncoder() {
  const bool is_standard_edgebreaker_available =
      options()->IsFeatureSupported(features::kEdgebreaker);
  const bool is_predictive_edgebreaker_available =
      options()->IsFeatureSupported(features::kPredictiveEdgebreaker);

  impl_ = nullptr;
  // For tiny meshes it's usually better to use the basic edgebreaker as the
  // overhead of the predictive one may turn out to be too big.
  const bool is_tiny_mesh = mesh()->num_faces() < 1000;

  int selected_edgebreaker_method =
      options()->GetGlobalInt("edgebreaker_method", -1);
  if (selected_edgebreaker_method == -1) {
    if (is_standard_edgebreaker_available &&
        (options()->GetSpeed() >= 5 || !is_predictive_edgebreaker_available ||
         is_tiny_mesh)) {
      selected_edgebreaker_method = MESH_EDGEBREAKER_STANDARD_ENCODING;
    } else {
      selected_edgebreaker_method = MESH_EDGEBREAKER_VALENCE_ENCODING;
    }
  }

  if (selected_edgebreaker_method == MESH_EDGEBREAKER_STANDARD_ENCODING) {
    if (is_standard_edgebreaker_available) {
      buffer()->Encode(
          static_cast<uint8_t>(MESH_EDGEBREAKER_STANDARD_ENCODING));
      impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
          new MeshEdgebreakerEncoderImpl<MeshEdgebreakerTraversalEncoder>());
    }
  } else if (selected_edgebreaker_method == MESH_EDGEBREAKER_VALENCE_ENCODING) {
    buffer()->Encode(static_cast<uint8_t>(MESH_EDGEBREAKER_VALENCE_ENCODING));
    impl_ = std::unique_ptr<MeshEdgebreakerEncoderImplInterface>(
        new MeshEdgebreakerEncoderImpl<
            MeshEdgebreakerTraversalValenceEncoder>());
  }
  if (!impl_) {
    return false;
  }
  if (!impl_->Init(this)) {
    return false;
  }
  return true;
}